

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

void bov_window_delete(bov_window_t *window)

{
  bov_text_delete(window->help);
  bov_text_delete(window->indication);
  (*glad_glDeleteTextures)(1,&window->font_atlas_texture);
  (*glad_glDeleteProgram)(window->program[0]);
  (*glad_glDeleteProgram)(window->program[1]);
  (*glad_glDeleteProgram)(window->program[2]);
  (*glad_glDeleteProgram)(window->program[3]);
  (*glad_glDeleteProgram)(window->program[5]);
  (*glad_glDeleteBuffers)(2,window->ubo);
  glfwDestroyWindow(window->self);
  glfwTerminate();
  free(window);
  return;
}

Assistant:

void bov_window_delete(bov_window_t* window)
{
	bov_text_delete(window->help);
	bov_text_delete(window->indication);
	glDeleteTextures(1, &window->font_atlas_texture);
	glDeleteProgram(window->program[TEXT_PROGRAM_INDEX]);
	glDeleteProgram(window->program[POINTS_PROGRAM_INDEX]);
	glDeleteProgram(window->program[LINES_PROGRAM_INDEX]);
	glDeleteProgram(window->program[CURVE_PROGRAM_INDEX]);
	glDeleteProgram(window->program[DEFAULT_PROGRAM_INDEX]);
	glDeleteBuffers(2, window->ubo);
	glfwDestroyWindow(window->self);
	glfwTerminate();
	free(window);
}